

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_> * __thiscall
kj::_::
NullableValue<kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>>>
::emplace<kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>>>
          (NullableValue<kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>>>
           *this,Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>
                 *params)

{
  if (*this == (NullableValue<kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>>>
                )0x1) {
    *this = (NullableValue<kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>>>
             )0x0;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)(this + 8));
  }
  *(PromiseNode **)(this + 8) = (params->super_PromiseBase).node.ptr;
  (params->super_PromiseBase).node.ptr = (PromiseNode *)0x0;
  *this = (NullableValue<kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>>>
           )0x1;
  return (Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_> *)
         (this + 8);
}

Assistant:

inline T& emplace(Params&&... params) {
    if (isSet) {
      isSet = false;
      dtor(value);
    }
    ctor(value, kj::fwd<Params>(params)...);
    isSet = true;
    return value;
  }